

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_if_connect_tcp(mg_connection *nc,socket_address *sa)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar1 = socket(2,1,0);
  nc->sock = iVar1;
  if (iVar1 < 0) {
    nc->sock = -1;
    piVar3 = __errno_location();
    nc->err = *piVar3 + (uint)(*piVar3 == 0);
  }
  else {
    uVar2 = fcntl64(iVar1,3,0);
    fcntl64(iVar1,4,uVar2 | 0x800);
    iVar1 = connect(nc->sock,(sockaddr *)&sa->sa,0x10);
    iVar1 = mg_is_error(iVar1);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      iVar4 = *piVar3;
    }
    nc->err = iVar4;
    if (LL_DEBUG < s_cs_log_level) {
      fprintf(_stderr,"%-20s ","mg_if_connect_tcp");
      cs_log_printf("%p sock %d err %d",nc,(ulong)(uint)nc->sock,(ulong)(uint)nc->err);
      return;
    }
  }
  return;
}

Assistant:

void mg_if_connect_tcp(struct mg_connection *nc,
                       const union socket_address *sa) {
    int rc;
    nc->sock = socket(AF_INET, SOCK_STREAM, 0);
    if (nc->sock < 0) {
        nc->sock = INVALID_SOCKET;
        nc->err = errno ? errno : 1;
        return;
    }
#if !defined(MG_CC3200) && !defined(MG_ESP8266)
    mg_set_non_blocking_mode(nc->sock);
#endif
    rc = connect(nc->sock, &sa->sa, sizeof(sa->sin));
    nc->err = mg_is_error(rc) ? errno : 0;
    DBG(("%p sock %d err %d", nc, nc->sock, nc->err));
}